

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O1

int get_relative_field_bit_offset_by_index
              (coda_cursor *cursor,long field_index,int64_t *rel_bit_offset)

{
  int64_t *piVar1;
  coda_dynamic_type_struct *pcVar2;
  coda_expression *expr;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int available_1;
  int64_t prev_bit_offset;
  int64_t bit_size;
  coda_cursor field_cursor;
  int local_364;
  long local_360;
  long *local_358;
  anon_struct_24_3_5e6533e2 *local_350;
  long local_348;
  coda_cursor local_340;
  
  pcVar2 = cursor->stack[(long)cursor->n + -1].type;
  lVar7 = *(long *)(*(long *)(pcVar2 + 5) + field_index * 8);
  lVar9 = *(long *)(lVar7 + 0x28);
  if (lVar9 < 0) {
    if (*(long *)(lVar7 + 0x30) == 0) {
      if (field_index == 0) {
        __assert_fail("field_index != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                      ,99,
                      "int get_relative_field_bit_offset_by_index(const coda_cursor *, long, int64_t *)"
                     );
      }
      local_350 = cursor->stack;
      lVar9 = 1;
      lVar7 = field_index;
      while ((lVar8 = *(long *)(*(long *)(pcVar2 + 5) + -8 + lVar7 * 8),
             *(long *)(lVar8 + 0x28) == -1 && (*(long *)(lVar8 + 0x30) == 0))) {
        lVar9 = lVar9 + 1;
        bVar3 = lVar7 < 2;
        lVar7 = lVar7 + -1;
        if (bVar3) {
          __assert_fail("index >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                        ,0x6e,
                        "int get_relative_field_bit_offset_by_index(const coda_cursor *, long, int64_t *)"
                       );
        }
      }
      lVar8 = lVar7 + -1;
      local_358 = rel_bit_offset;
      iVar4 = get_relative_field_bit_offset_by_index(cursor,lVar8,&local_360);
      if (iVar4 != 0) {
        return -1;
      }
      memcpy(&local_340,cursor,0x310);
      lVar6 = (long)local_340.n;
      local_340.n = local_340.n + 1;
      local_340.stack[lVar6].bit_offset = local_360 + local_350[(long)cursor->n + -1].bit_offset;
      if (lVar7 <= field_index) {
        do {
          local_364 = 1;
          expr = *(coda_expression **)(*(long *)(*(long *)(pcVar2 + 5) + lVar8 * 8) + 0x20);
          if ((expr != (coda_expression *)0x0) &&
             (iVar4 = coda_expression_eval_bool(expr,cursor,&local_364), iVar4 != 0)) {
            coda_add_error_message(" for available expression");
            return -1;
          }
          if (local_364 != 0) {
            lVar7 = (long)local_340.n;
            local_340.stack[lVar7 + -1].type =
                 *(coda_dynamic_type_struct **)(*(long *)(*(long *)(pcVar2 + 5) + lVar8 * 8) + 0x10)
            ;
            local_340.stack[lVar7 + -1].index = lVar8;
            iVar4 = coda_cursor_get_bit_size(&local_340,&local_348);
            if (iVar4 != 0) {
              return -1;
            }
            local_360 = local_360 + local_348;
            piVar1 = &local_340.stack[(long)local_340.n + -1].bit_offset;
            *piVar1 = *piVar1 + local_348;
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      *local_358 = local_360;
    }
    else {
      if (*(coda_expression **)(lVar7 + 0x20) != (coda_expression *)0x0) {
        iVar4 = coda_expression_eval_bool
                          (*(coda_expression **)(lVar7 + 0x20),cursor,(int *)&local_340);
        iVar5 = (int)lVar9;
        if (iVar4 == 0) {
          if ((int)local_340.product == 0) {
            if (field_index == 0) {
              *rel_bit_offset = 0;
              iVar5 = 0;
            }
            else {
              iVar5 = get_relative_field_bit_offset_by_index(cursor,field_index + -1,rel_bit_offset)
              ;
            }
            bVar3 = false;
          }
          else {
            bVar3 = true;
          }
        }
        else {
          bVar3 = false;
          coda_add_error_message(" for available expression");
          coda_cursor_add_to_error_message(cursor);
          iVar5 = -1;
        }
        if (!bVar3) {
          return iVar5;
        }
      }
      iVar4 = coda_expression_eval_integer
                        (*(coda_expression **)(lVar7 + 0x30),cursor,rel_bit_offset);
      if (iVar4 != 0) {
        coda_add_error_message(" for offset expression");
        coda_cursor_add_to_error_message(cursor);
        return -1;
      }
    }
  }
  else {
    *rel_bit_offset = lVar9;
  }
  return 0;
}

Assistant:

static int get_relative_field_bit_offset_by_index(const coda_cursor *cursor, long field_index, int64_t *rel_bit_offset)
{
    coda_type_record_field *field;
    coda_type_record *record;
    coda_cursor field_cursor;
    int64_t prev_bit_offset;
    long index;
    long i;

    record = (coda_type_record *)cursor->stack[cursor->n - 1].type;
    field = record->field[field_index];

    if (field->bit_offset >= 0)
    {
        /* use static offset */
        *rel_bit_offset = field->bit_offset;
        return 0;
    }

    if (field->bit_offset_expr != NULL)
    {
        if (field->available_expr != NULL)
        {
            int available;

            if (coda_expression_eval_bool(field->available_expr, cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            /* don't evaluate offset expression if field is not available! */
            if (!available)
            {
                if (field_index == 0)
                {
                    /* Just set to 0. With a proper format definition you should actually never have this case. */
                    *rel_bit_offset = 0;
                    return 0;
                }
                else
                {
                    /* the size of this field is zero, so just use the offset of the previous field */
                    return get_relative_field_bit_offset_by_index(cursor, field_index - 1, rel_bit_offset);
                }
            }
        }
        /* determine offset using expr */
        if (coda_expression_eval_integer(field->bit_offset_expr, cursor, rel_bit_offset) != 0)
        {
            coda_add_error_message(" for offset expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    assert(field_index != 0);   /* the first field should either have a fixed bit offset or a bit_offset_expr */

    /* determine offset by:
     *  - finding previous field with a fixed bit_offset or a bit_offset_expr
     *  - calculating the bit offset for that field
     *  - adding bit sizes of fields after that offset until we get to our field
     */
    index = field_index - 1;
    while (record->field[index]->bit_offset == -1 && record->field[index]->bit_offset_expr == NULL)
    {
        index--;
        assert(index >= 0);
    }
    if (get_relative_field_bit_offset_by_index(cursor, index, &prev_bit_offset) != 0)
    {
        return -1;
    }
    field_cursor = *cursor;
    field_cursor.n++;
    field_cursor.stack[field_cursor.n - 1].bit_offset = cursor->stack[cursor->n - 1].bit_offset + prev_bit_offset;
    for (i = index; i < field_index; i++)
    {
        int64_t bit_size;
        int available = 1;

        if (record->field[i]->available_expr != NULL)
        {
            if (coda_expression_eval_bool(record->field[i]->available_expr, cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                return -1;
            }
        }
        if (available)
        {
            field_cursor.stack[field_cursor.n - 1].type = (coda_dynamic_type *)record->field[i]->type;
            field_cursor.stack[field_cursor.n - 1].index = i;
            if (coda_cursor_get_bit_size(&field_cursor, &bit_size) != 0)
            {
                return -1;
            }
            prev_bit_offset += bit_size;
            field_cursor.stack[field_cursor.n - 1].bit_offset += bit_size;
        }
    }
    *rel_bit_offset = prev_bit_offset;

    return 0;
}